

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
DisasmReplayer::enqueue_create_sampler
          (DisasmReplayer *this,Hash hash,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  VkResult VVar1;
  VkSampler_T *pVVar2;
  VkSampler *sampler_local;
  VkSamplerCreateInfo *create_info_local;
  Hash hash_local;
  DisasmReplayer *this_local;
  
  sampler_local = (VkSampler *)create_info;
  create_info_local = (VkSamplerCreateInfo *)hash;
  hash_local = (Hash)this;
  if (this->device == (VulkanDevice *)0x0) {
    pVVar2 = fake_handle<VkSampler_T*>(hash);
    *sampler = pVVar2;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating sampler %0lX\n",hash);
    fflush(_stderr);
    VVar1 = Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
                      (this->device,(VkSamplerCreateInfo *)sampler_local,sampler);
    if (VVar1 != VK_SUCCESS) {
      fprintf(_stderr,"Fossilize ERROR:  ... Failed!\n");
      fflush(_stderr);
      return false;
    }
    fprintf(_stderr,"Fossilize INFO:  ... Succeeded!\n");
    fflush(_stderr);
  }
  std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::push_back(&this->samplers,sampler);
  std::vector<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>::push_back
            (&this->sampler_infos,(value_type *)&sampler_local);
  return true;
}

Assistant:

bool enqueue_create_sampler(Hash hash, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		if (device)
		{
			LOGI("Creating sampler %0" PRIX64 "\n", hash);
			if (device->create_sampler_with_ycbcr_remap(create_info, sampler) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*sampler = fake_handle<VkSampler>(hash);

		samplers.push_back(*sampler);
		sampler_infos.push_back(create_info);
		return true;
	}